

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O1

Matrix * Mul_SM(double S,Matrix *M)

{
  LASErrIdType LVar1;
  Matrix *M_00;
  char *pcVar2;
  size_t sVar3;
  char *Object1Name;
  
  M_Lock(M);
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    M_00 = (Matrix *)malloc(0x50);
    pcVar2 = M_GetName(M);
    sVar3 = strlen(pcVar2);
    pcVar2 = (char *)malloc(sVar3 + 0x14);
    Object1Name = M_GetName(M);
    if (pcVar2 == (char *)0x0 || M_00 == (Matrix *)0x0) {
      LASError(LASMemAllocErr,"Mul_SM",Object1Name,(char *)0x0,(char *)0x0);
      if (M_00 != (Matrix *)0x0) {
        free(M_00);
      }
    }
    else {
      sprintf(pcVar2,"%12.5e * (%s)",S,Object1Name);
      M_Constr(M_00,pcVar2,M->RowDim,M->ClmDim,M->ElOrder,Tempor,False);
      LVar1 = LASResult();
      if (LVar1 == LASOK) {
        M_00->Multipl = S * M->Multipl;
        M_00->Len = M->Len;
        M_00->El = M->El;
        M_00->ElSorted = M->ElSorted;
      }
    }
    if (pcVar2 != (char *)0x0) {
      free(pcVar2);
    }
  }
  else {
    M_00 = (Matrix *)0x0;
  }
  M_Unlock(M);
  return M_00;
}

Assistant:

Matrix *Mul_SM(double S, Matrix *M)
/* MRes = S * M */
{
    Matrix *MRes;

    char *MResName;

    M_Lock(M);

    if (LASResult() == LASOK) {
        MRes = (Matrix *)malloc(sizeof(Matrix));
        MResName = (char *)malloc((strlen(M_GetName(M)) + 20) * sizeof(char));
        if (MRes != NULL && MResName != NULL) {
            sprintf(MResName, "%12.5e * (%s)", S, M_GetName(M));
            M_Constr(MRes, MResName,  M->RowDim, M->ClmDim, M->ElOrder, Tempor, False);
            if (LASResult() == LASOK) {
                MRes->Multipl = S * M->Multipl;
                MRes->Len = M->Len;
                MRes->El = M->El;
                MRes->ElSorted = M->ElSorted;
            }
        } else {
            LASError(LASMemAllocErr, "Mul_SM", M_GetName(M), NULL, NULL);
            if (MRes != NULL)
                free(MRes);
        }
            
        if (MResName != NULL)
            free(MResName);
    } else {
        MRes = NULL;
    }

    M_Unlock(M);

    return(MRes);
}